

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

Own<capnp::ClientHook,_std::nullptr_t> __thiscall
capnp::_::WireHelpers::readCapabilityPointer
          (WireHelpers *this,SegmentReader *segment,CapTableReader *capTable,WirePointer *ref,
          int nestingLimit)

{
  BrokenCapFactory *pBVar1;
  bool bVar2;
  uint uVar3;
  Own<capnp::ClientHook,_std::nullptr_t> *pOVar4;
  ClientHook *extraout_RDX;
  Own<capnp::ClientHook,_std::nullptr_t> OVar5;
  StringPtr local_f8;
  Fault local_e8;
  Fault f_2;
  Own<capnp::ClientHook,_std::nullptr_t> *cap;
  undefined1 local_c8 [8];
  OwnOwn<capnp::ClientHook,_std::nullptr_t> _cap2241;
  undefined8 local_b0;
  Fault local_a8;
  Fault f_1;
  Fault local_98;
  Fault f;
  BrokenCapFactory **local_88;
  undefined1 local_80 [8];
  DebugComparison<capnp::_::BrokenCapFactory_*&,_std::nullptr_t> _kjCondition;
  BrokenCapFactory *local_48;
  BrokenCapFactory *brokenCapFactory;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> maybeCap;
  int nestingLimit_local;
  WirePointer *ref_local;
  CapTableReader *capTable_local;
  SegmentReader *segment_local;
  
  maybeCap.ptr.ptr._4_4_ = nestingLimit;
  kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::Maybe
            ((Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)&brokenCapFactory);
  local_48 = readGlobalBrokenCapFactoryForLayoutCpp();
  local_88 = (BrokenCapFactory **)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_48);
  f.exception = (Exception *)0x0;
  kj::_::DebugExpression<capnp::_::BrokenCapFactory*&>::operator!=
            ((DebugComparison<capnp::_::BrokenCapFactory_*&,_std::nullptr_t> *)local_80,
             (DebugExpression<capnp::_::BrokenCapFactory*&> *)&local_88,&f.exception);
  bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_80);
  if (!bVar2) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::BrokenCapFactory*&,decltype(nullptr)>&,char_const(&)[192]>
              (&local_98,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x8b5,FAILED,"brokenCapFactory != nullptr",
               "_kjCondition,\"Trying to read capabilities without ever having created a capability context.  \" \"To read capabilities from a message, you must imbue it with CapReaderContext, or \" \"use the Cap\'n Proto RPC system.\""
               ,(DebugComparison<capnp::_::BrokenCapFactory_*&,_std::nullptr_t> *)local_80,
               (char (*) [192])
               "Trying to read capabilities without ever having created a capability context.  To read capabilities from a message, you must imbue it with CapReaderContext, or use the Cap\'n Proto RPC system."
              );
    kj::_::Debug::Fault::fatal(&local_98);
  }
  bVar2 = WirePointer::isNull(ref);
  if (bVar2) {
    (**(code **)(*(long *)local_48 + 8))(this);
    f_1.exception._4_4_ = 1;
  }
  else {
    bVar2 = WirePointer::isCapability(ref);
    if (bVar2) {
      uVar3 = DirectWireValue<unsigned_int>::get
                        ((DirectWireValue<unsigned_int> *)&(ref->field_1).structRef);
      (**capTable->_vptr_CapTableReader)(&cap,capTable,(ulong)uVar3);
      kj::_::readMaybe<capnp::ClientHook,decltype(nullptr)>
                ((_ *)local_c8,(Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)&cap);
      kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::~Maybe
                ((Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)&cap);
      pOVar4 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_c8);
      if (pOVar4 == (Own<capnp::ClientHook,_std::nullptr_t> *)0x0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45]>
                  (&local_e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x8c4,FAILED,(char *)0x0,"\"Message contains invalid capability pointer.\"",
                   (char (*) [45])"Message contains invalid capability pointer.");
        f_1.exception._4_4_ = 8;
        kj::_::Debug::Fault::~Fault(&local_e8);
        pBVar1 = local_48;
        kj::StringPtr::StringPtr(&local_f8,"Calling invalid capability pointer.");
        (*(code *)**(undefined8 **)pBVar1)(this,pBVar1,local_f8.content.ptr,local_f8.content.size_);
      }
      else {
        f_2.exception =
             (Exception *)
             kj::_::OwnOwn<capnp::ClientHook,_std::nullptr_t>::operator*
                       ((OwnOwn<capnp::ClientHook,_std::nullptr_t> *)local_c8);
        pOVar4 = kj::mv<kj::Own<capnp::ClientHook,decltype(nullptr)>>
                           ((Own<capnp::ClientHook,_std::nullptr_t> *)f_2.exception);
        kj::Own<capnp::ClientHook,_std::nullptr_t>::Own
                  ((Own<capnp::ClientHook,_std::nullptr_t> *)this,pOVar4);
      }
      f_1.exception._4_4_ = 1;
      kj::_::OwnOwn<capnp::ClientHook,_std::nullptr_t>::~OwnOwn
                ((OwnOwn<capnp::ClientHook,_std::nullptr_t> *)local_c8);
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[96]>
                (&local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x8bc,FAILED,(char *)0x0,
                 "\"Schema mismatch: Message contains non-capability pointer where capability pointer was \" \"expected.\""
                 ,(char (*) [96])
                  "Schema mismatch: Message contains non-capability pointer where capability pointer was expected."
                );
      f_1.exception._4_4_ = 5;
      kj::_::Debug::Fault::~Fault(&local_a8);
      pBVar1 = local_48;
      kj::StringPtr::StringPtr
                ((StringPtr *)&_cap2241.value.ptr,
                 "Calling capability extracted from a non-capability pointer.");
      (*(code *)**(undefined8 **)pBVar1)(this,pBVar1,_cap2241.value.ptr,local_b0);
      f_1.exception._4_4_ = 1;
    }
  }
  kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::~Maybe
            ((Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)&brokenCapFactory);
  OVar5.ptr = extraout_RDX;
  OVar5.disposer = (Disposer *)this;
  return OVar5;
}

Assistant:

static KJ_ALWAYS_INLINE(kj::Own<ClientHook> readCapabilityPointer(
      SegmentReader* segment, CapTableReader* capTable,
      const WirePointer* ref, int nestingLimit)) {
    kj::Maybe<kj::Own<ClientHook>> maybeCap;

    auto brokenCapFactory = readGlobalBrokenCapFactoryForLayoutCpp();

    KJ_REQUIRE(brokenCapFactory != nullptr,
               "Trying to read capabilities without ever having created a capability context.  "
               "To read capabilities from a message, you must imbue it with CapReaderContext, or "
               "use the Cap'n Proto RPC system.");

    if (ref->isNull()) {
      return brokenCapFactory->newNullCap();
    } else if (!ref->isCapability()) {
      KJ_FAIL_REQUIRE(
          "Schema mismatch: Message contains non-capability pointer where capability pointer was "
          "expected.") {
        break;
      }
      return brokenCapFactory->newBrokenCap(
          "Calling capability extracted from a non-capability pointer.");
    } else KJ_IF_SOME(cap, capTable->extractCap(ref->capRef.index.get())) {
      return kj::mv(cap);
    } else {
      KJ_FAIL_REQUIRE("Message contains invalid capability pointer.") {
        break;
      }